

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O2

void __thiscall
presolve::HighsPostsolveStack::undoPrimal
          (HighsPostsolveStack *this,HighsOptions *options,HighsSolution *solution,
          HighsInt report_col)

{
  HighsBasis basis;
  HighsBasis local_88;
  
  (this->reductionValues).position =
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
  HighsBasis::HighsBasis(&local_88);
  local_88.valid = false;
  solution->dual_valid = false;
  undo(this,options,solution,&local_88,report_col);
  HighsBasis::~HighsBasis(&local_88);
  return;
}

Assistant:

void undoPrimal(const HighsOptions& options, HighsSolution& solution,
                  const HighsInt report_col = -1) {
    // Call to reductionValues.resetPosition(); seems unnecessary as
    // it's the first thing done in undo
    reductionValues.resetPosition();
    HighsBasis basis;
    basis.valid = false;
    solution.dual_valid = false;
    undo(options, solution, basis, report_col);
  }